

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::ProfiledNewScFltArray<true>
          (InterpreterStackFrame *this,OpLayoutDynamicProfile<Js::OpLayoutAuxiliary> *playout)

{
  ProfileId index;
  FunctionBody *this_00;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  AuxArray<double> *doubles;
  DynamicProfileInfo *this_01;
  ArrayCallSiteInfo *this_02;
  JavascriptNativeArray *this_03;
  RecyclerWeakReferenceBase *weakRef;
  undefined4 *puVar3;
  Var pvVar4;
  ulong uVar5;
  SparseArraySegmentBase *addr;
  
  doubles = ByteCodeReader::ReadAuxArray<double>
                      ((playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset,
                       *(FunctionBody **)(this + 0x88));
  index = playout->profileId;
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  this_02 = DynamicProfileInfo::GetArrayCallSiteInfo(this_01,this_00,index);
  if (this_02 == (ArrayCallSiteInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1584,"(arrayInfo)","arrayInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  else if ((((this_02->field_0).bits & 2) == 0) &&
          (bVar2 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), !bVar2)) {
    ArrayCallSiteInfo::SetIsNotNativeIntArray(this_02);
    this_03 = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                         (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),doubles->count)->
               super_JavascriptNativeArray;
    JavascriptOperators::AddFloatsToArraySegment
              ((SparseArraySegment<double> *)(this_03->super_JavascriptArray).head.ptr,doubles);
    recycler = *(Recycler **)(*(long *)(this + 0x78) + 0x1200);
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&recycler->weakReferenceMap,(char *)this_00,recycler);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&FunctionBody::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
    }
    JavascriptNativeArray::SetArrayCallSite
              (this_03,index,(RecyclerWeakReference<Js::FunctionBody> *)weakRef);
    goto LAB_00a6b72e;
  }
  this_03 = (JavascriptNativeArray *)
            JavascriptLibrary::CreateArrayLiteral
                      (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),doubles->count);
  if (doubles->count != 0) {
    addr = (this_03->super_JavascriptArray).head.ptr + 1;
    uVar5 = 0;
    do {
      pvVar4 = JavascriptNumber::ToVarNoCheck
                         ((double)doubles[uVar5 + 1],*(ScriptContext **)(this + 0x78));
      Memory::Recycler::WBSetBit((char *)addr);
      *(Var *)addr = pvVar4;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      uVar5 = uVar5 + 1;
      addr = (SparseArraySegmentBase *)&addr->size;
    } while (uVar5 < doubles->count);
  }
LAB_00a6b72e:
  JavascriptArray::CheckForceES5Array(&this_03->super_JavascriptArray);
  SetReg<unsigned_int>(this,(playout->super_OpLayoutAuxiliary).R0,this_03);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledNewScFltArray(const unaligned OpLayoutDynamicProfile<OpLayoutAuxiliary> * playout)
    {
        if (!Profiled && !isAutoProfiling)
        {
            OP_NewScFltArray(playout);
            return;
        }

        const Js::AuxArray<double> *doubles = Js::ByteCodeReader::ReadAuxArray<double>(playout->Offset, this->GetFunctionBody());

        Js::ProfileId  profileId = playout->profileId;
        FunctionBody *functionBody = this->m_functionBody;
        ArrayCallSiteInfo *arrayInfo = functionBody->GetDynamicProfileInfo()->GetArrayCallSiteInfo(functionBody, profileId);
        Assert(arrayInfo);

        JavascriptArray *arr;
        if (arrayInfo && arrayInfo->IsNativeFloatArray())
        {
            arrayInfo->SetIsNotNativeIntArray();
            arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(doubles->count);
            SparseArraySegment<double> * segment = (SparseArraySegment<double>*)arr->GetHead();
            JavascriptOperators::AddFloatsToArraySegment(segment, doubles);

            JavascriptNativeFloatArray *floatArray = reinterpret_cast<JavascriptNativeFloatArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            floatArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else
        {
            arr = scriptContext->GetLibrary()->CreateArrayLiteral(doubles->count);
            SparseArraySegment<Var> * segment = (SparseArraySegment<Var>*)arr->GetHead();
            for (uint i = 0; i < doubles->count; i++)
            {
                segment->elements[i] = JavascriptNumber::ToVarNoCheck(doubles->elements[i], scriptContext);
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }